

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_core.cpp
# Opt level: O2

void __thiscall so_5::impl::layer_core_t::finish(layer_core_t *this)

{
  shutdown_extra_layers(this);
  wait_extra_layers(this);
  shutdown_default_layers(this);
  wait_default_layers(this);
  return;
}

Assistant:

void
layer_core_t::finish()
{
	// Shutdown and wait extra layers.
	shutdown_extra_layers();
	wait_extra_layers();

	// Shutdown and wait default layers.
	shutdown_default_layers();
	wait_default_layers();
}